

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week14-app2.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  double dVar1;
  initializer_list<int> __l;
  initializer_list<short> __l_00;
  initializer_list<char> __l_01;
  initializer_list<double> __l_02;
  ulong uVar2;
  cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
  *pcVar3;
  bool bVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  double *pdVar8;
  char *pcVar9;
  reference pvVar10;
  reference pvVar11;
  reference pdVar12;
  reference piVar13;
  iterator iStack_2b8;
  int a_3;
  iterator __end1_2;
  iterator __begin1_2;
  vector<int> *__range1_2;
  int local_298 [8];
  iterator local_278;
  size_type local_270;
  undefined1 local_268 [8];
  vector<int> v_1;
  double a_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double> *__range1_1;
  int local_228;
  int i_2;
  int k;
  int sum;
  undefined1 local_218 [8];
  reverse_view<ranges::ref_view<std::vector<short,_std::allocator<short>_>_>_> *local_210;
  int local_208;
  allocator<short> local_203;
  short local_202;
  int result;
  undefined2 local_1fc;
  undefined2 local_1fa;
  iterator local_1f8;
  size_type local_1f0;
  undefined1 local_1e8 [8];
  vector<short> v;
  undefined1 local_1c8 [8];
  generate_view<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week14_app2_cpp:59:20)>
  multiples_of_2;
  anon_class_1_0_00000001 powers_of_k;
  value_type b_1;
  size_t j;
  value_type a_1;
  int i_1;
  char *b;
  double *a;
  undefined1 local_178 [8];
  facade_sentinel_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
  __end1;
  facade_iterator_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
  __begin1;
  reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_> local_140;
  cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
  local_130;
  view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)_1>
  *local_110;
  cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
  *__range1;
  size_t i;
  double sum2;
  reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_> local_e8;
  invoke_result_t<ranges::views::take_base_fn,_ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_int>
  local_d8;
  double local_b8;
  double sum1;
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  vector<char> v2;
  allocator<double> local_69;
  double local_68 [4];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<double> v1;
  anon_class_1_0_00000001 new_line;
  anon_class_1_0_00000001 horizontal_line;
  char **param_1_local;
  int param_0_local;
  
  v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_68[2] = 10.5;
  local_68[3] = 20.1;
  local_68[0] = 3.14;
  local_68[1] = 2.7;
  local_48 = local_68;
  local_40 = 4;
  std::allocator<double>::allocator(&local_69);
  __l_02._M_len = local_40;
  __l_02._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,__l_02,&local_69);
  std::allocator<double>::~allocator(&local_69);
  sum1._3_1_ = 0x31;
  sum1._4_1_ = 0x31;
  sum1._5_1_ = 0x30;
  sum1._6_1_ = 0x31;
  sum1._7_1_ = 0x31;
  local_a8 = (iterator)((long)&sum1 + 3);
  local_a0 = 5;
  std::allocator<char>::allocator();
  __l_01._M_len = local_a0;
  __l_01._M_array = local_a8;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_98,__l_01,
             (allocator_type *)((long)&sum1 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sum1 + 2));
  local_e8.rng_.rng_ =
       (vector<double,_std::allocator<double>_> *)
       ranges::views::view_closure_base_ns::
       operator|<std::vector<double,_std::allocator<double>_>_&,_ranges::views::reverse_fn>
                 (local_38);
  register0x00000000 =
       (tuple_t)ranges::views::take_fn::operator()<int>((take_fn *)&ranges::views::take,2);
  ranges::views::view_closure_base_ns::
  operator|<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::detail::bind_back_fn_<ranges::views::take_base_fn,_int>_>
            (&local_d8,&local_e8,
             (view_closure<ranges::detail::bind_back_fn_<ranges::views::take_base_fn,_int>_>)
             register0x00000000);
  local_b8 = ranges::accumulate_fn::
             operator()<ranges::take_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>_>,_double,_ranges::plus,_ranges::identity>
                       ((accumulate_fn *)0x0,&ranges::accumulate,&local_d8);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_b8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  i = 0;
  __range1 = (cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
              *)std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)local_38);
  while( true ) {
    __range1 = (cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
                *)((long)&__range1[-1].views_.
                          super__Tuple_impl<0UL,_ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_false>
                          ._M_head_impl.rng_.rng_ + 7);
    pcVar3 = __range1;
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_38);
    if (pcVar3 < (cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
                  *)(sVar6 - 3)) break;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(size_type)__range1);
    i = (size_t)(*pvVar7 + (double)i);
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_b8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  local_140.rng_.rng_ =
       (vector<double,_std::allocator<double>_> *)
       ranges::views::view_closure_base_ns::
       operator|<std::vector<double,_std::allocator<double>_>_&,_ranges::views::reverse_fn>
                 (local_38);
  ranges::views::cartesian_product_fn::
  operator()<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_std::vector<char,_std::allocator<char>_>_&>
            (&local_130,(cartesian_product_fn *)&ranges::views::cartesian_product,&local_140,
             (vector<char,_std::allocator<char>_> *)local_98);
  local_110 = (view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)_1>
               *)&local_130;
  ranges::
  view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)-1>
  ::
  begin<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>_>
            ((facade_iterator_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
              *)((long)&__end1.
                        super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                        .
                        super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                        .
                        super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                        .
                        super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                        .value.its_ + 8),local_110);
  ranges::
  view_facade<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>,_(ranges::cardinality)-1>
  ::
  end<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>_>
            ((facade_sentinel_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
              *)local_178,local_110);
  while (bVar4 = ranges::
                 operator!=<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>_>
                           ((basic_iterator<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>_>
                             *)((long)&__end1.
                                       super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                       .
                                       super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                                       .
                                       super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                                       .
                                       super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                                       .value.its_ + 8),
                            (basic_iterator<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>_>
                             *)local_178), bVar4) {
    ranges::
    basic_iterator<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>_>
    ::operator*((basic_iterator<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>_>
                 *)&a);
    pdVar8 = ranges::_tuple_wrapper_::get<0ul,std::tuple<double&,char&>>
                       ((forward_tuple_interface<std::tuple<double_&,_char_&>_> *)&a);
    pcVar9 = ranges::_tuple_wrapper_::get<1ul,std::tuple<double&,char&>>
                       ((forward_tuple_interface<std::tuple<double_&,_char_&>_> *)&a);
    poVar5 = std::operator<<((ostream *)&std::cout,"[");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pdVar8);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,*pcVar9);
    poVar5 = std::operator<<(poVar5,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    ranges::
    basic_iterator<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>_>
    ::operator++((basic_iterator<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>_>
                  *)((long)&__end1.
                            super_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                            .
                            super_readable_iterator_associated_types_base<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void>
                            .
                            super_mixin_base_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>::cursor<false>_>
                            .
                            super_box<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                            .value.its_ + 8));
  }
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar6 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_38);
  a_1._4_4_ = (int)sVar6;
  while (a_1._4_4_ = a_1._4_4_ + -1, -1 < a_1._4_4_) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(long)a_1._4_4_);
    dVar1 = *pvVar7;
    for (stack0xfffffffffffffe50 = 0; uVar2 = stack0xfffffffffffffe50,
        sVar6 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_98), uVar2 < sVar6 - 1;
        register0x00000000 = stack0xfffffffffffffe50 + 1) {
      pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_98,stack0xfffffffffffffe50);
      multiples_of_2.val_.super_optional<int>.super_move_assign_layer<int>.
      super_optional_storage<int,_true>.field_0.data_._3_1_ = *pvVar10;
      poVar5 = std::operator<<((ostream *)&std::cout,"[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar1);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,multiples_of_2.val_.super_optional<int>.
                                      super_move_assign_layer<int>.super_optional_storage<int,_true>
                                      .field_0.data_._3_1_);
      poVar5 = std::operator<<(poVar5,"]");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  multiples_of_2.val_.super_optional<int>.super_move_assign_layer<int>.
  super_optional_storage<int,_true>.field_0.data_._2_1_ = 0;
  v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)main::$_0::operator()
                          ((__0 *)((long)&multiples_of_2.val_.super_optional<int>.
                                          super_move_assign_layer<int>.
                                          super_optional_storage<int,_true>.field_0 + 2),2);
  ranges::views::generate_fn::
  operator()<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week14_app2_cpp:59:20)>
            ((generate_view<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week14_app2_cpp:59:20)>
              *)local_1c8,(generate_fn *)&ranges::views::generate,
             (anon_class_8_2_94731007_for_data_)
             v.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  local_202 = 1;
  result._0_2_ = 1;
  result._2_2_ = 0;
  local_1fc = 1;
  local_1fa = 1;
  local_1f8 = &local_202;
  local_1f0 = 5;
  std::allocator<short>::allocator(&local_203);
  __l_00._M_len = local_1f0;
  __l_00._M_array = local_1f8;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)local_1e8,__l_00,&local_203);
  std::allocator<short>::~allocator(&local_203);
  local_210 = ranges::views::view_closure_base_ns::
              operator|<std::vector<short,_std::allocator<short>_>_&,_ranges::views::reverse_fn>
                        (local_1e8);
  local_208 = ranges::inner_product_fn::
              operator()<ranges::reverse_view<ranges::ref_view<std::vector<short,_std::allocator<short>_>_>_>,_ranges::generate_view<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week14_app2_cpp:59:20)>_&,_int,_ranges::plus,_ranges::multiplies,_ranges::identity,_ranges::identity,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>_>_>,_ranges::basic_iterator<ranges::generate_view<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week14_app2_cpp:59:20)>::cursor>_>
                        ((inner_product_fn *)&ranges::inner_product,local_218,local_1c8,0);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_208);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  i_2 = 0;
  local_228 = 1;
  sVar6 = std::vector<short,_std::allocator<short>_>::size
                    ((vector<short,_std::allocator<short>_> *)local_1e8);
  __range1_1._4_4_ = (int)sVar6;
  while (__range1_1._4_4_ = __range1_1._4_4_ + -1, -1 < __range1_1._4_4_) {
    pvVar11 = std::vector<short,_std::allocator<short>_>::operator[]
                        ((vector<short,_std::allocator<short>_> *)local_1e8,(long)__range1_1._4_4_);
    i_2 = local_228 * *pvVar11 + i_2;
    local_228 = local_228 << 1;
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i_2);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)local_1e8);
  ranges::
  generate_view<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/week14-app2.cpp:59:20)>
  ::~generate_view((generate_view<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week14_app2_cpp:59:20)>
                    *)local_1c8);
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  ranges::actions::action_closure_base_ns::operator|=(local_38);
  __end1_1 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_38);
  a_2 = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)local_38);
  while (bVar4 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                           (&__end1_1,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&a_2), ((bVar4 ^ 0xffU) & 1) != 0) {
    pdVar12 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator*(&__end1_1);
    v_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*pdVar12;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (double)v_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_1);
  }
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  local_298[4] = 5;
  local_298[5] = 0x14;
  local_298[6] = 5;
  local_298[7] = 10;
  local_298[0] = 10;
  local_298[1] = 10;
  local_298[2] = 5;
  local_298[3] = 5;
  local_278 = local_298;
  local_270 = 8;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1_2 + 7));
  __l._M_len = local_270;
  __l._M_array = local_278;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l,
             (allocator<int> *)((long)&__range1_2 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1_2 + 7));
  ranges::actions::action_closure_base_ns::operator|=(local_268);
  __end1_2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_268);
  iStack_2b8 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_268);
  while (bVar4 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                           (&__end1_2,&stack0xfffffffffffffd48), ((bVar4 ^ 0xffU) & 1) != 0) {
    piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&__end1_2);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar13);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_2);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_268);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_98)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto horizontal_line = [] { std::cout << "------" << std::endl; };
    auto new_line = [] { std::cout << std::endl; };

    auto v1 = vector<double>{3.14, 2.7, 10.5, 20.1};
    auto v2 = vector<char>{'1', '1', '0', '1', '1'};

    { // example #1: accumulate
        // below is a single for loop implementation summing things up
        auto sum1 = accumulate(v1 | views::reverse | views::take(2), 0.0);
        std::cout << sum1 << std::endl;

        horizontal_line();

        // this is the old-school way of writing it
        auto sum2 = 0.0;
        for(size_t i=v1.size()-1; i>=v1.size()-1-2; --i)
            sum2 += v1[i];
        std::cout << sum1 << std::endl;
    }
    new_line();

    { // example #2: nested-for-loop implementation with ranges
        // below is a nested-for-loop equivalent of going over v1 and v2.
        // nesting is actually equivalent to taking cartesian_product in mathematics
        for(auto [a, b] : views::cartesian_product(v1 | views::reverse, v2))
            std::cout << "[" << a << ", " << b << "]" << std::endl;

        horizontal_line();

        // this is the old-school nested for loop version! very prone to bugs.
        for(int i=v1.size()-1; i>=0; --i)
        {
            auto a = v1[i];
            for(size_t j=0; j<v2.size()-1; ++j)
            {
                auto b = v2[j];
                std::cout << "[" << a << ", " << b << "]" << std::endl;
            }
        }
    }
    new_line();

    { // example #3: inner-product (dot-product) -> single for-loop coupled with some other action

        // this is a generator that returns 1, k^1, k^2, k^3, k^4, ... respectively for each call
        auto powers_of_k = [](auto k) {
            return [i=1, k]() mutable { return (i*=k)/k; };
        };

        // make it a ranges-library compatible generator that generate 1, 2, 4, 8, 16, ...
        auto multiples_of_2 = views::generate(powers_of_k(2));

        auto v = vector<short>{1, 1, 0, 1, 1}; // base 10 repr. of binary number: 1*1 + 2*1 + 4*0 + 8*1 + 16*1

        auto result = inner_product(v | views::reverse, multiples_of_2, 0);
        std::cout << result << std::endl;

        horizontal_line();

        // this is the old-school version! very prone to bugs.
        auto sum = 0;
        auto k = 1;
        for(int i=v.size()-1; i>=0; --i)
        {
            sum += k * v[i];
            k *= 2;
        }
        std::cout << sum << std::endl;
    }
    new_line();

    // you can easily sort things with ranges library
    {
        v1 |= actions::sort;
        for(auto a : v1)
            std::cout << a << std::endl;
    }
    new_line();

    // you can easily get non-repeating (unique) elements with ranges library
    {
        auto v = vector<int>{10, 10, 5, 5, 5, 20, 5, 10};
        v |= actions::unique; // produces 10, 5, 20, 5, 10
        for(auto a : v)
            std::cout << a << std::endl;
    }
    return 0;
}